

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpndrv.h
# Opt level: O3

CTcPrsNode * __thiscall CTPNStmForBase::adjust_for_dyn(CTPNStmForBase *this,tcpn_dyncomp_info *info)

{
  CTcPrsNode *pCVar1;
  CTPNStm *pCVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  
  pCVar1 = this->init_expr_;
  if (pCVar1 != (CTcPrsNode *)0x0) {
    iVar3 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x11])(pCVar1,info);
    this->init_expr_ = (CTcPrsNode *)CONCAT44(extraout_var,iVar3);
  }
  pCVar1 = this->cond_expr_;
  if (pCVar1 != (CTcPrsNode *)0x0) {
    iVar3 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x11])(pCVar1,info);
    this->cond_expr_ = (CTcPrsNode *)CONCAT44(extraout_var_00,iVar3);
  }
  pCVar1 = this->reinit_expr_;
  if (pCVar1 != (CTcPrsNode *)0x0) {
    iVar3 = (*(pCVar1->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase[0x11])(pCVar1,info);
    this->reinit_expr_ = (CTcPrsNode *)CONCAT44(extraout_var_01,iVar3);
  }
  pCVar2 = this->body_stm_;
  if (pCVar2 != (CTPNStm *)0x0) {
    iVar3 = (*(pCVar2->super_CTPNStmBase).super_CTcPrsNode.super_CTcPrsNodeBase._vptr_CTcPrsNodeBase
              [0x11])(pCVar2,info);
    this->body_stm_ = (CTPNStm *)CONCAT44(extraout_var_02,iVar3);
  }
  return (CTcPrsNode *)this;
}

Assistant:

class CTcPrsNode *adjust_for_dyn(const tcpn_dyncomp_info *info)
    {
        if (init_expr_ != 0)
            init_expr_ = init_expr_->adjust_for_dyn(info);
        if (cond_expr_ != 0)
            cond_expr_ = cond_expr_->adjust_for_dyn(info);
        if (reinit_expr_ != 0)
            reinit_expr_ = reinit_expr_->adjust_for_dyn(info);
        if (body_stm_ != 0)
            body_stm_ = (CTPNStm *)body_stm_->adjust_for_dyn(info);

        return this;
    }